

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::piece_picker::record_downloading_piece(piece_picker *this,piece_index_t p)

{
  uint uVar1;
  pointer ppVar2;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>_>
  _Var3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> piece;
  long lVar5;
  bool bVar6;
  piece_extent_t this_extent;
  piece_extent_t local_34;
  
  if (this->m_blocks_per_piece < 0x100) {
    local_34.m_val = p.m_val / (int)(0x100 / this->m_blocks_per_piece);
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>const>>
                      ((this->m_recent_extents).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_recent_extents).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (_Var3._M_current ==
        (this->m_recent_extents).
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar2 = (this->m_piece_map).
               super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(ppVar2 + p.m_val);
      iVar4 = extent_for(this,local_34);
      bVar6 = true;
      for (lVar5 = (long)iVar4._begin.m_val.m_val; (long)iVar4 >> 0x20 != lVar5; lVar5 = lVar5 + 1)
      {
        if (p.m_val != lVar5) {
          if (0x1fffffff < (*(uint *)(ppVar2 + lVar5) ^ uVar1)) {
            return;
          }
          bVar6 = (bool)(bVar6 & ((prio_index_t *)((long)(ppVar2 + lVar5) + 4))->m_val == -1);
        }
      }
      if ((!bVar6) &&
         ((ulong)((long)_Var3._M_current -
                 (long)(this->m_recent_extents).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x11)) {
        std::
        vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
        ::push_back(&this->m_recent_extents,&local_34);
      }
    }
  }
  return;
}

Assistant:

void piece_picker::record_downloading_piece(piece_index_t const p)
	{
		// if a single piece is large enough, don't bother with the affinity of
		// adjecent pieces.
		if (m_blocks_per_piece >= max_piece_affinity_extent) return;

		piece_extent_t const this_extent = extent_for(p);

		// if the extent is already in the list, nothing to do
		if (std::find(m_recent_extents.begin()
			, m_recent_extents.end(), this_extent) != m_recent_extents.end())
			return;

		download_priority_t const this_prio = piece_priority(p);

		// figure out if it's worth recording this downloading piece
		// if we already have all blocks in this extent, there's no point in
		// adding it
		bool have_all = true;

		for (auto const piece : extent_for(this_extent))
		{
			if (piece == p) continue;

			if (!m_piece_map[piece].have()) have_all = false;

			// if at least one piece in this extent has a different priority than
			// the one we just started downloading, don't create an affinity for
			// adjecent pieces. This probably means the pieces belong to different
			// files, or that some other mechanism determining the priority should
			// take precedence.
			if (piece_priority(piece) != this_prio) return;
		}

		// if we already have all the *other* pieces in this extent, there's no
		// need to inflate their priorities
		if (have_all) return;

		// TODO: should 5 be configurable?
		if (m_recent_extents.size() < 5)
			m_recent_extents.push_back(this_extent);

		// limit the number of extent affinities active at any given time to limit
		// the cost of checking them. Also, don't replace them, commit to
		// finishing them before starting another extent. This is analoguous to
		// limiting the number of partial pieces.
	}